

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O2

void __thiscall
serial::Serial::SerialImpl::SerialImpl
          (SerialImpl *this,string *port,unsigned_long baudrate,bytesize_t bytesize,parity_t parity,
          stopbits_t stopbits,flowcontrol_t flowcontrol)

{
  int __oflag;
  char *__file;
  
  this->_vptr_SerialImpl = (_func_int **)&PTR__SerialImpl_00111cb0;
  std::__cxx11::string::string((string *)&this->port_,(string *)port);
  this->fd_ = -1;
  this->is_open_ = false;
  this->xonxoff_ = false;
  this->rtscts_ = false;
  (this->timeout_).write_timeout_multiplier = 0;
  (this->timeout_).inter_byte_timeout = 0;
  (this->timeout_).read_timeout_constant = 0;
  (this->timeout_).read_timeout_multiplier = 0;
  (this->timeout_).write_timeout_constant = 0;
  this->baudrate_ = baudrate;
  this->parity_ = parity;
  this->bytesize_ = bytesize;
  this->stopbits_ = stopbits;
  this->flowcontrol_ = flowcontrol;
  pthread_mutex_init((pthread_mutex_t *)&this->read_mutex,(pthread_mutexattr_t *)0x0);
  __file = (char *)0x0;
  pthread_mutex_init((pthread_mutex_t *)&this->write_mutex,(pthread_mutexattr_t *)0x0);
  if ((this->port_)._M_string_length != 0) {
    open(this,__file,__oflag);
  }
  return;
}

Assistant:

Serial::SerialImpl::SerialImpl (const string &port, unsigned long baudrate,
                                bytesize_t bytesize,
                                parity_t parity, stopbits_t stopbits,
                                flowcontrol_t flowcontrol)
  : port_ (port), fd_ (-1), is_open_ (false), xonxoff_ (false), rtscts_ (false),
    baudrate_ (baudrate), parity_ (parity),
    bytesize_ (bytesize), stopbits_ (stopbits), flowcontrol_ (flowcontrol)
{
  pthread_mutex_init(&this->read_mutex, NULL);
  pthread_mutex_init(&this->write_mutex, NULL);
  if (port_.empty () == false)
    open ();
}